

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O3

void __thiscall ThreadContext::InitAvailableCommit(ThreadContext *this)

{
  BOOL BVar1;
  ULONG64 local_10;
  ULONG64 commit;
  
  BVar1 = AutoSystemInfo::GetAvailableCommit(&AutoSystemInfo::Data,&local_10);
  if (BVar1 == 0) {
    local_10 = 0xffffffffffffffff;
    AutoSystemInfo::SetAvailableCommit(&AutoSystemInfo::Data,0xffffffffffffffff);
  }
  return;
}

Assistant:

void ThreadContext::InitAvailableCommit()
{
    // Once per process: get the available commit for the process from the OS and push it to the AutoSystemInfo.
    // (This must be done lazily, outside DllMain. And it must be done from the Runtime, since the common lib
    // doesn't have access to the DelayLoadLibrary stuff.)
    ULONG64 commit;
    BOOL success = AutoSystemInfo::Data.GetAvailableCommit(&commit);
    if (!success)
    {
        commit = (ULONG64)-1;
#ifdef NTBUILD
        APP_MEMORY_INFORMATION AppMemInfo;
        success = GetWinCoreProcessThreads()->GetProcessInformation(
            GetCurrentProcess(),
            ProcessAppMemoryInfo,
            &AppMemInfo,
            sizeof(AppMemInfo));
        if (success)
        {
            commit = AppMemInfo.AvailableCommit;
        }
#endif
        AutoSystemInfo::Data.SetAvailableCommit(commit);
    }
}